

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

void __thiscall rapidxml::xml_node<char>::remove_all_nodes(xml_node<char> *this)

{
  xml_node<char> *pxVar1;
  xml_node<char> **ppxVar2;
  
  ppxVar2 = &this->m_first_node;
  while (pxVar1 = *ppxVar2, pxVar1 != (xml_node<char> *)0x0) {
    (pxVar1->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
    ppxVar2 = &pxVar1->m_next_sibling;
  }
  this->m_first_node = (xml_node<char> *)0x0;
  return;
}

Assistant:

xml_node<Ch> *first_node(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *child = m_first_node; child; child = child->next_sibling())
                    if (internal::compare(child->name(), child->name_size(), name, name_size, case_sensitive))
                        return child;
                return 0;
            }
            else
                return m_first_node;
        }